

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

Signedness __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::Visit
          (IsGreaterThanZero *this,SEValueUnknown *node)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  Signedness SVar4;
  DefUseManager *this_00;
  Instruction *this_01;
  TypeManager *this_02;
  Type *pTVar5;
  undefined4 extraout_var;
  Integer *int_type;
  Type *type;
  Instruction *insn;
  SEValueUnknown *node_local;
  IsGreaterThanZero *this_local;
  
  this_00 = IRContext::get_def_use_mgr(this->context_);
  uVar2 = SEValueUnknown::ResultId(node);
  this_01 = analysis::DefUseManager::GetDef(this_00,uVar2);
  this_02 = IRContext::get_type_mgr(this->context_);
  uVar2 = opt::Instruction::type_id(this_01);
  pTVar5 = analysis::TypeManager::GetType(this_02,uVar2);
  if (pTVar5 == (Type *)0x0) {
    __assert_fail("type && \"Can\'t retrieve a type for the instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                  ,0x34e,
                  "Signedness spvtools::opt::(anonymous namespace)::IsGreaterThanZero::Visit(const SEValueUnknown *)"
                 );
  }
  iVar3 = (*pTVar5->_vptr_Type[9])();
  if (pTVar5 == (Type *)0x0) {
    __assert_fail("type && \"Can\'t retrieve an integer type for the instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                  ,0x350,
                  "Signedness spvtools::opt::(anonymous namespace)::IsGreaterThanZero::Visit(const SEValueUnknown *)"
                 );
  }
  bVar1 = analysis::Integer::IsSigned((Integer *)CONCAT44(extraout_var,iVar3));
  SVar4 = kPositive;
  if (bVar1) {
    SVar4 = kPositiveOrNegative;
  }
  return SVar4;
}

Assistant:

Signedness Visit(const SEValueUnknown* node) {
    Instruction* insn = context_->get_def_use_mgr()->GetDef(node->ResultId());
    analysis::Type* type = context_->get_type_mgr()->GetType(insn->type_id());
    assert(type && "Can't retrieve a type for the instruction");
    analysis::Integer* int_type = type->AsInteger();
    assert(type && "Can't retrieve an integer type for the instruction");
    return int_type->IsSigned() ? Signedness::kPositiveOrNegative
                                : Signedness::kPositive;
  }